

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

void start_element_handler(void *data,char *el,char **attr)

{
  coda_format format;
  coda_dynamic_type *pcVar1;
  hashtable *table;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  coda_mem_array *pcVar7;
  coda_type_array *pcVar8;
  coda_mem_record *pcVar9;
  coda_type_record *pcVar10;
  coda_xml_product *product;
  char *pcVar11;
  coda_type_array *definition;
  ulong index;
  coda_mem_record *parent;
  coda_dynamic_type *local_40;
  coda_mem_array *local_38;
  
  iVar4 = *(int *)((long)data + 0x18);
  lVar5 = (long)iVar4;
  pcVar1 = *(coda_dynamic_type **)((long)data + lVar5 * 8 + 0x120);
  if (pcVar1 == (coda_dynamic_type *)0x0) {
    pcVar6 = *(char **)((long)data + lVar5 * 8 + 800);
    pcVar11 = "mixed content for element \'%s\' is not supported";
LAB_0016a081:
    coda_set_error(-300,pcVar11,pcVar6);
    goto LAB_0016a0b0;
  }
  format = pcVar1->definition->format;
  if (format != coda_format_xml) {
    el = *(char **)((long)data + lVar5 * 8 + 800);
    pcVar6 = coda_type_get_format_name(format);
    pcVar11 = "xml element \'%s\' not allowed inside %s data";
LAB_0016a0a9:
    coda_set_error(-300,pcVar11,el,pcVar6);
    goto LAB_0016a0b0;
  }
  *(undefined8 *)((long)data + 0x430) = 0;
  if (0x1e < iVar4) {
    coda_set_error(-300,"xml file exceeds maximum supported hierarchical depth (%d)",0x20);
    goto LAB_0016a0b0;
  }
  *(int *)((long)data + 0x18) = iVar4 + 1;
  *(undefined8 *)((long)data + lVar5 * 8 + 0x128) = 0;
  local_40 = pcVar1;
  lVar5 = coda_hashtable_get_index_from_name(*(hashtable **)&pcVar1->definition[1].type_class,el);
  uVar3 = (uint)lVar5;
  if ((int)uVar3 < 0) {
    table = *(hashtable **)&local_40->definition[1].type_class;
    pcVar6 = coda_element_name_from_xml_name(el);
    lVar5 = coda_hashtable_get_index_from_name(table,pcVar6);
    uVar3 = (uint)lVar5;
  }
  if ((int)uVar3 < 0) {
    if (*(int *)((long)data + 0x428) == 0) {
      if ((long)*(int *)((long)data + 0x18) == 1) {
        pcVar11 = "xml element \'%s\' is not allowed as root element";
        pcVar6 = el;
        goto LAB_0016a081;
      }
      pcVar6 = *(char **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x318);
      pcVar11 = "xml element \'%s\' is not allowed within element \'%s\'";
      goto LAB_0016a0a9;
    }
    pcVar10 = coda_type_record_new(coda_format_xml);
    if (pcVar10 == (coda_type_record *)0x0) goto LAB_0016a0b0;
    iVar4 = coda_type_record_create_field
                      ((coda_type_record *)local_40->definition,el,(coda_type *)pcVar10);
    coda_type_release((coda_type *)pcVar10);
    if ((iVar4 != 0) || (iVar4 = coda_mem_type_update(&local_40,local_40->definition), iVar4 != 0))
    goto LAB_0016a0b0;
    if (local_40 !=
        *(coda_dynamic_type **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x118)) {
      __assert_fail("parent == info->record[info->depth - 1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                    ,0x18b,"void start_element_handler(void *, const char *, const char **)");
    }
    lVar5 = coda_hashtable_get_index_from_name
                      (*(hashtable **)&local_40->definition[1].type_class,el);
    uVar3 = (uint)lVar5;
    if ((int)uVar3 < 0) {
      __assert_fail("index >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                    ,0x18d,"void start_element_handler(void *, const char *, const char **)");
    }
  }
  index = (ulong)uVar3;
  iVar4 = *(int *)((long)data + 0x18);
  *(ulong *)((long)data + (long)iVar4 * 8 + 0x220) = index;
  *(long *)((long)data + (long)iVar4 * 8 + 0x20) =
       *(long *)(local_40->definition[1].description + index * 8) + 0x10;
  iVar4 = coda_type_get_record_field_real_name
                    (local_40->definition,index,(char **)((long)data + (long)iVar4 * 8 + 800));
  if (iVar4 != 0) goto LAB_0016a0b0;
  definition = (coda_type_array *)
               **(undefined8 **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x20);
  if (definition->type_class == coda_array_class) {
    if (definition->format == coda_format_xml) {
      if (*(long *)(&(local_40[2].definition)->format + index * 2) == 0) {
        pcVar7 = coda_mem_array_new(definition,(coda_dynamic_type *)0x0);
        *(coda_mem_array **)(&(local_40[2].definition)->format + index * 2) = pcVar7;
        if (*(long *)(&(local_40[2].definition)->format + index * 2) == 0) goto LAB_0016a0b0;
      }
      *(coda_type ***)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x20) =
           &definition->base_type;
      definition = (coda_type_array *)definition->base_type;
    }
  }
  else if (*(long *)(&(local_40[2].definition)->format + index * 2) != 0) {
    if (*(int *)((long)data + 0x428) == 0) {
      pcVar6 = *(char **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x318);
      pcVar11 = "xml element \'%s\' is not allowed more than once within element \'%s\'";
      goto LAB_0016a0a9;
    }
    pcVar8 = coda_type_array_new(coda_format_xml);
    if (pcVar8 == (coda_type_array *)0x0) {
LAB_0016a34b:
      bVar2 = false;
      coda_XML_StopParser(*data,'\0');
      *(undefined4 *)((long)data + 8) = 1;
    }
    else {
      iVar4 = coda_type_array_set_base_type(pcVar8,(coda_type *)definition);
      if (iVar4 != 0) {
        coda_type_release((coda_type *)pcVar8);
        goto LAB_0016a34b;
      }
      **(undefined8 **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x20) = pcVar8;
      coda_type_release((coda_type *)definition);
      iVar4 = coda_type_array_add_variable_dimension(pcVar8,(coda_expression *)0x0);
      if (((iVar4 != 0) ||
          (pcVar7 = coda_mem_array_new(pcVar8,(coda_dynamic_type *)0x0),
          pcVar7 == (coda_mem_array *)0x0)) ||
         (local_38 = pcVar7,
         iVar4 = coda_mem_array_add_element
                           (pcVar7,*(coda_dynamic_type **)
                                    (&(local_40[2].definition)->format + index * 2)), iVar4 != 0))
      goto LAB_0016a34b;
      *(coda_mem_array **)(&(local_40[2].definition)->format + index * 2) = local_38;
      *(coda_type ***)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x20) =
           &pcVar8->base_type;
      definition = (coda_type_array *)pcVar8->base_type;
      bVar2 = true;
    }
    if (!bVar2) {
      return;
    }
  }
  pcVar10 = definition->attributes;
  if (pcVar10 == (coda_type_record *)0x0) {
    *(undefined8 *)((long)data + 0x420) = 0;
    pcVar6 = *attr;
    if (*(int *)((long)data + 0x428) == 0) {
      if (pcVar6 != (char *)0x0) {
        pcVar11 = "xml attribute \'%s\' is not allowed";
        goto LAB_0016a081;
      }
    }
    else if ((pcVar6 != (char *)0x0) || (pcVar6 = coda_element_name_from_xml_name(el), pcVar6 != el)
            ) {
      pcVar10 = coda_type_record_new(coda_format_xml);
      definition->attributes = pcVar10;
      if (pcVar10 == (coda_type_record *)0x0) goto LAB_0016a0b0;
      product = *(coda_xml_product **)((long)data + 0x10);
      iVar4 = *(int *)((long)data + 0x428);
      goto LAB_0016a380;
    }
  }
  else {
    product = *(coda_xml_product **)((long)data + 0x10);
    iVar4 = *(int *)((long)data + 0x428);
LAB_0016a380:
    pcVar9 = attribute_record_new(pcVar10,product,el,attr,iVar4);
    *(coda_mem_record **)((long)data + 0x420) = pcVar9;
    if (pcVar9 == (coda_mem_record *)0x0) goto LAB_0016a0b0;
  }
  if (definition->format != coda_format_xml) {
    return;
  }
  if (definition->type_class != coda_record_class) {
    return;
  }
  if ((int)definition->dim[2] != 0) {
    __assert_fail("!((coda_type_record *)definition)->is_union",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                  ,0x223,"void start_element_handler(void *, const char *, const char **)");
  }
  pcVar9 = coda_mem_record_new((coda_type_record *)definition,
                               *(coda_dynamic_type **)((long)data + 0x420));
  *(coda_mem_record **)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) = pcVar9;
  if (pcVar9 != (coda_mem_record *)0x0) {
    if (0 < *(long *)(*(long *)((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120) + 0x20))
    {
      lVar5 = 0;
      do {
        pcVar8 = *(coda_type_array **)(*(long *)(definition->dim[0] + lVar5 * 8) + 0x10);
        if ((pcVar8->type_class == coda_array_class) && (pcVar8->format == coda_format_xml)) {
          pcVar7 = coda_mem_array_new(pcVar8,(coda_dynamic_type *)0x0);
          iVar4 = *(int *)((long)data + 0x18);
          *(coda_mem_array **)
           (*(long *)(*(long *)((long)data + (long)iVar4 * 8 + 0x120) + 0x28) + lVar5 * 8) = pcVar7;
          if (*(long *)(*(long *)(*(long *)((long)data + (long)iVar4 * 8 + 0x120) + 0x28) +
                       lVar5 * 8) == 0) goto LAB_0016a0b0;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < *(long *)(*(long *)((long)data +
                                          (long)*(int *)((long)data + 0x18) * 8 + 0x120) + 0x20));
    }
    *(undefined8 *)((long)data + 0x420) = 0;
    return;
  }
LAB_0016a0b0:
  coda_XML_StopParser(*data,'\0');
  *(undefined4 *)((long)data + 8) = 1;
  return;
}

Assistant:

static void XMLCALL start_element_handler(void *data, const char *el, const char **attr)
{
    parser_info *info = (parser_info *)data;
    xml_element_tag tag;

    if (info->unparsed_depth > 0)
    {
        /* We are inside an element of another namespace -> ignore this element */
        info->unparsed_depth++;
        return;
    }

    tag = (xml_element_tag)hashtable_get_index_from_name(info->hash_data, el);
    if (tag < 0 && strncmp(el, CODA_DEFINITION_NAMESPACE, strlen(CODA_DEFINITION_NAMESPACE)) != 0)
    {
        /* start of a branch from some other namespace */
        info->unparsed_depth = 1;
        return;
    }
    if (tag < 0 || info->node->init_sub_element[tag] == NULL)
    {
        if (info->node->tag == no_element)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "xml element '%s' is not allowed as root element",
                           coda_element_name_from_xml_name(el));
        }
        else if (info->node->format_set)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION,
                           "xml element '%s' is not allowed within element '%s'{%s}",
                           coda_element_name_from_xml_name(el), xml_element_name(info->node->tag),
                           coda_type_get_format_name(info->node->format));
        }
        else
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "xml element '%s' is not allowed within element '%s'",
                           coda_element_name_from_xml_name(el), xml_element_name(info->node->tag));
        }
        abort_parser(info);
        return;
    }

    if (push_node(info, tag, attr) != 0)
    {
        abort_parser(info);
    }
}